

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

bool slang::syntax::ArgumentSyntax::isKind(SyntaxKind kind)

{
  bool local_9;
  SyntaxKind kind_local;
  
  if (((kind == EmptyArgument) || (kind == NamedArgument)) || (kind == OrderedArgument)) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool ArgumentSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::EmptyArgument:
        case SyntaxKind::NamedArgument:
        case SyntaxKind::OrderedArgument:
            return true;
        default:
            return false;
    }
}